

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osifcnet.cpp
# Opt level: O0

void __thiscall OS_HttpPayload::add_tstr(OS_HttpPayload *this,char *name,char *val)

{
  OS_HttpPayloadItem *item;
  char *name_00;
  OS_HttpPayloadItem *this_00;
  size_t val_len;
  long in_RSI;
  OS_HttpPayload *in_RDI;
  
  item = (OS_HttpPayloadItem *)operator_new(0x28);
  name_00 = (char *)(in_RSI + 2);
  this_00 = (OS_HttpPayloadItem *)vmb_get_len((char *)0x24c582);
  val_len = vmb_get_len((char *)0x24c59e);
  OS_HttpPayloadItem::OS_HttpPayloadItem(this_00,name_00,(size_t)item,(char *)in_RDI,val_len);
  add(in_RDI,item);
  return;
}

Assistant:

void OS_HttpPayload::add_tstr(const char *name, const char *val)
{
    add(new OS_HttpPayloadItem(name + VMB_LEN, vmb_get_len(name),
                               val + VMB_LEN, vmb_get_len(val)));
}